

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringsTest.cc
# Opt level: O2

int main(int param_1,char **param_2)

{
  bool bVar1;
  __type _Var2;
  size_t sVar3;
  undefined1 uVar4;
  FILE *pFVar5;
  long lVar6;
  undefined8 *puVar7;
  string *psVar8;
  byte bVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<unsigned_long> __l_23;
  string s2;
  allocator<char> local_1b9;
  string s3;
  string s4;
  string s1;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [47];
  allocator<char> local_c9;
  string s5;
  string expected_formatted_input;
  string formatted_input;
  vector<unsigned_long,_std::allocator<unsigned_long>_> expected_offsets;
  string local_50;
  
  bVar9 = 0;
  fwrite("-- starts_with\n",0xf,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"abc",(allocator<char> *)&s4);
  bVar1 = phosg::starts_with(&s1,&s2);
  phosg::expect_generic
            (bVar1,"!(starts_with(\"abcdef\", \"abc\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1b8);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"abcdef",(allocator<char> *)&s4);
  bVar1 = phosg::starts_with(&s1,&s2);
  phosg::expect_generic
            (bVar1,"!(starts_with(\"abcdef\", \"abcdef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1b9);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"abcdefg",(allocator<char> *)&s4)
  ;
  bVar1 = phosg::starts_with(&s1,&s2);
  phosg::expect_generic
            (!bVar1,"!(!starts_with(\"abcdef\", \"abcdefg\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ba);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"abd",(allocator<char> *)&s4);
  bVar1 = phosg::starts_with(&s1,&s2);
  phosg::expect_generic
            (!bVar1,"!(!starts_with(\"abcdef\", \"abd\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1bb);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"dbc",(allocator<char> *)&s4);
  bVar1 = phosg::starts_with(&s1,&s2);
  phosg::expect_generic
            (!bVar1,"!(!starts_with(\"abcdef\", \"dbc\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1bc);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- ends_with\n",0xd,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"def",(allocator<char> *)&s4);
  bVar1 = phosg::ends_with(&s1,&s2);
  phosg::expect_generic
            (bVar1,"!(ends_with(\"abcdef\", \"def\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1bf);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"abcdef",(allocator<char> *)&s4);
  bVar1 = phosg::ends_with(&s1,&s2);
  phosg::expect_generic
            (bVar1,"!(ends_with(\"abcdef\", \"abcdef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c0);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"gabcdef",(allocator<char> *)&s4)
  ;
  bVar1 = phosg::ends_with(&s1,&s2);
  phosg::expect_generic
            (!bVar1,"!(!ends_with(\"abcdef\", \"gabcdef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"ded",(allocator<char> *)&s4);
  bVar1 = phosg::ends_with(&s1,&s2);
  phosg::expect_generic
            (!bVar1,"!(!ends_with(\"abcdef\", \"ded\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c2);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"fef",(allocator<char> *)&s4);
  bVar1 = phosg::ends_with(&s1,&s2);
  phosg::expect_generic
            (!bVar1,"!(!ends_with(\"abcdef\", \"fef\"))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c3);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- str_replace_all\n",0x13,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"",(allocator<char> *)&s3);
  phosg::str_replace_all(&s1,&s2,"def","xyz");
  bVar1 = std::operator==(&s1,"");
  phosg::expect_generic
            (bVar1,"\"\" != str_replace_all(string(\"\"), \"def\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c7);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"abcdef",(allocator<char> *)&s3);
  phosg::str_replace_all(&s1,&s2,"efg","xyz");
  bVar1 = std::operator==(&s1,"abcdef");
  phosg::expect_generic
            (bVar1,"\"abcdef\" != str_replace_all(string(\"abcdef\"), \"efg\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c8);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"abcdef",(allocator<char> *)&s3);
  phosg::str_replace_all(&s1,&s2,"def","xyz");
  bVar1 = std::operator==(&s1,"abcxyz");
  phosg::expect_generic
            (bVar1,"\"abcxyz\" != str_replace_all(string(\"abcdef\"), \"def\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1c9);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"abcdefabc",(allocator<char> *)&s3);
  phosg::str_replace_all(&s1,&s2,"def","xyz");
  bVar1 = std::operator==(&s1,"abcxyzabc");
  phosg::expect_generic
            (bVar1,"\"abcxyzabc\" != str_replace_all(string(\"abcdefabc\"), \"def\", \"xyz\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ca);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"abcdefabcdef",(allocator<char> *)&s3);
  phosg::str_replace_all(&s1,&s2,"def","xyz");
  bVar1 = std::operator==(&s1,"abcxyzabcxyz");
  phosg::expect_generic
            (bVar1,"\"abcxyzabcxyz\" != str_replace_all(string(\"abcdefabcdef\"), \"def\", \"xyz\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1cb);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"abcdefabcdefabc",(allocator<char> *)&s3);
  phosg::str_replace_all(&s1,&s2,"def","xyz");
  bVar1 = std::operator==(&s1,"abcxyzabcxyzabc");
  phosg::expect_generic
            (bVar1,
             "\"abcxyzabcxyzabc\" != str_replace_all(string(\"abcdefabcdefabc\"), \"def\", \"xyz\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1cc);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"defabcdefabcdefabc",(allocator<char> *)&s3);
  phosg::str_replace_all(&s1,&s2,"def","xyz");
  bVar1 = std::operator==(&s1,"xyzabcxyzabcxyzabc");
  phosg::expect_generic
            (bVar1,
             "\"xyzabcxyzabcxyzabc\" != str_replace_all(string(\"defabcdefabcdefabc\"), \"def\", \"xyz\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1cd);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  fwrite("-- strip_trailing_zeroes\n",0x19,1,_stderr);
  s1._M_dataplus._M_p = (pointer)&s1.field_2;
  s1._M_string_length = 6;
  s1.field_2._M_allocated_capacity._0_7_ = 0x666564636261;
  phosg::strip_trailing_zeroes<std::__cxx11::string>(&s1);
  bVar1 = std::operator==(&s1,"abcdef");
  phosg::expect_generic
            (bVar1,"s1 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1d4);
  s2._M_string_length = 7;
  s2.field_2._M_allocated_capacity = 0x666564636261;
  s2._M_dataplus._M_p = (pointer)&s2.field_2;
  phosg::strip_trailing_zeroes<std::__cxx11::string>(&s2);
  bVar1 = std::operator==(&s2,"abcdef");
  phosg::expect_generic
            (bVar1,"s2 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1d7);
  s3._M_dataplus._M_p = (pointer)&s3.field_2;
  s3.field_2._M_allocated_capacity._0_7_ = 0x666564636261;
  s3.field_2._7_4_ = 0;
  s3._M_string_length = 0xb;
  s3.field_2._M_local_buf[0xb] = '\0';
  phosg::strip_trailing_zeroes<std::__cxx11::string>(&s3);
  bVar1 = std::operator==(&s3,"abcdef");
  phosg::expect_generic
            (bVar1,"s3 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1da);
  s4._M_dataplus._M_p = (pointer)&s4.field_2;
  s4._M_string_length = 0;
  s4.field_2._M_local_buf[0] = '\0';
  phosg::strip_trailing_zeroes<std::__cxx11::string>(&s4);
  bVar1 = std::operator==(&s4,"");
  phosg::expect_generic
            (bVar1,"s4 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1dd);
  s5._M_dataplus._M_p = (pointer)&s5.field_2;
  s5.field_2._M_allocated_capacity._0_4_ = 0;
  s5.field_2._M_allocated_capacity._4_2_ = 0;
  s5._M_string_length = 5;
  phosg::strip_trailing_zeroes<std::__cxx11::string>(&s5);
  bVar1 = std::operator==(&s5,"");
  phosg::expect_generic
            (bVar1,"s5 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1e0);
  std::__cxx11::string::~string((string *)&s5);
  std::__cxx11::string::~string((string *)&s4);
  std::__cxx11::string::~string((string *)&s3);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- strip_trailing_whitespace\n",0x1d,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s2);
  phosg::strip_trailing_whitespace<std::__cxx11::string>(&s1);
  bVar1 = std::operator==(&s1,"abcdef");
  phosg::expect_generic
            (bVar1,"s1 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1e7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"abcdef\r\n",(allocator<char> *)&s3);
  phosg::strip_trailing_whitespace<std::__cxx11::string>(&s2);
  bVar1 = std::operator==(&s2,"abcdef");
  phosg::expect_generic
            (bVar1,"s2 != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ea);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s3,"abc\tdef  \r\n",(allocator<char> *)&s4);
  phosg::strip_trailing_whitespace<std::__cxx11::string>(&s3);
  bVar1 = std::operator==(&s3,"abc\tdef");
  phosg::expect_generic
            (bVar1,"s3 != \"abc\\tdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ed);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s4,"",(allocator<char> *)&s5);
  phosg::strip_trailing_whitespace<std::__cxx11::string>(&s4);
  bVar1 = std::operator==(&s4,"");
  phosg::expect_generic
            (bVar1,"s4 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s5,"   \t\r\n  ",(allocator<char> *)&expected_formatted_input);
  phosg::strip_trailing_whitespace<std::__cxx11::string>(&s5);
  bVar1 = std::operator==(&s5,"");
  phosg::expect_generic
            (bVar1,"s5 != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,499);
  std::__cxx11::string::~string((string *)&s5);
  std::__cxx11::string::~string((string *)&s4);
  std::__cxx11::string::~string((string *)&s3);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- strip_whitespace\n",0x14,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"abcdef",(allocator<char> *)&s2);
  phosg::strip_whitespace<std::__cxx11::string>(&s1);
  bVar1 = std::operator==(&s1,"abcdef");
  phosg::expect_generic
            (bVar1,"s != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1fb);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&s1,"abcdef\r\n");
  phosg::strip_whitespace<std::__cxx11::string>(&s1);
  bVar1 = std::operator==(&s1,"abcdef");
  phosg::expect_generic
            (bVar1,"s != \"abcdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x1ff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&s1,"  \nabc\tdef");
  phosg::strip_whitespace<std::__cxx11::string>(&s1);
  bVar1 = std::operator==(&s1,"abc\tdef");
  phosg::expect_generic
            (bVar1,"s != \"abc\\tdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x203);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&s1,"  \nabc\tdef  \r\n");
  phosg::strip_whitespace<std::__cxx11::string>(&s1);
  bVar1 = std::operator==(&s1,"abc\tdef");
  phosg::expect_generic
            (bVar1,"s != \"abc\\tdef\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x207);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign(&s1,"");
  phosg::strip_whitespace<std::__cxx11::string>(&s1);
  bVar1 = std::operator==(&s1,"");
  phosg::expect_generic
            (bVar1,"s != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x20b);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&s1,"   \t\r\n  ");
  phosg::strip_whitespace<std::__cxx11::string>(&s1);
  bVar1 = std::operator==(&s1,"");
  phosg::expect_generic
            (bVar1,"s != \"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x20f);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- strip_multiline_comments\n",0x1c,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,"abc/*def*/ghi",(allocator<char> *)&s2);
  phosg::strip_multiline_comments<std::__cxx11::string>(&s1,false);
  bVar1 = std::operator==(&s1,"abcghi");
  phosg::expect_generic
            (bVar1,"s != \"abcghi\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x217);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&s1,"/*abc*/def\r\n");
  phosg::strip_multiline_comments<std::__cxx11::string>(&s1,false);
  bVar1 = std::operator==(&s1,"def\r\n");
  phosg::expect_generic
            (bVar1,"s != \"def\\r\\n\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x21b);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&s1,"abc\n/*def\nghi*/\njkl");
  phosg::strip_multiline_comments<std::__cxx11::string>(&s1,false);
  bVar1 = std::operator==(&s1,"abc\n\n\njkl");
  phosg::expect_generic
            (bVar1,"s != \"abc\\n\\n\\njkl\"",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x21f);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- string_printf\n",0x11,1,_stderr);
  phosg::string_printf_abi_cxx11_(&s1,"%s %lu 0x%04hX","lolz",1000,0x4f);
  fprintf(_stderr,"%s\n",s1._M_dataplus._M_p);
  bVar1 = std::operator==(&s1,"lolz 1000 0x004F");
  phosg::expect_generic
            (bVar1,"\"lolz 1000 0x004F\" != result",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x227);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- split\n",9,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"567",(allocator<char> *)&formatted_input);
  std::__cxx11::string::string<std::allocator<char>>(local_118,"abc",(allocator<char> *)&local_50);
  __l._M_len = 4;
  __l._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l,(allocator_type *)&expected_offsets);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"12,34,567,abc",&local_1b9);
  phosg::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34\", \"567\", \"abc\"}) != split(\"12,34,567,abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x60;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"567",(allocator<char> *)&formatted_input);
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"",(allocator<char> *)&expected_offsets);
  __l_00._M_len = 5;
  __l_00._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_00,(allocator_type *)&local_1b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"12,34,567,,",&local_c9);
  phosg::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34\", \"567\", \"\", \"\"}) != split(\"12,34,567,,\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x80;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"",(allocator<char> *)&s5);
  __l_01._M_len = 1;
  __l_01._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_01,(allocator_type *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"",(allocator<char> *)&formatted_input);
  phosg::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,"vector<string>({\"\"}) != split(\"\", \',\')",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"a",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"b",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"c d e f",(allocator<char> *)&formatted_input);
  __l_02._M_len = 3;
  __l_02._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_02,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"a b c d e f",(allocator<char> *)&expected_offsets);
  phosg::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&s4,&s2,' ',2);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,"vector<string>({\"a\", \"b\", \"c d e f\"}) != split(\"a b c d e f\", \' \', 2)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x22f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  fwrite("-- split_context\n",0x11,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"567",(allocator<char> *)&formatted_input);
  std::__cxx11::string::string<std::allocator<char>>(local_118,"abc",(allocator<char> *)&local_50);
  __l_03._M_len = 4;
  __l_03._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_03,(allocator_type *)&expected_offsets);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"12,34,567,abc",&local_1b9);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34\", \"567\", \"abc\"}) != split_context(\"12,34,567,abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x234);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x60;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"567",(allocator<char> *)&formatted_input);
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"",(allocator<char> *)&expected_offsets);
  __l_04._M_len = 5;
  __l_04._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_04,(allocator_type *)&local_1b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"12,34,567,,",&local_c9);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34\", \"567\", \"\", \"\"}) != split_context(\"12,34,567,,\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x235);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x80;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"",(allocator<char> *)&s5);
  __l_05._M_len = 1;
  __l_05._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_05,(allocator_type *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"",(allocator<char> *)&formatted_input);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,"vector<string>({\"\"}) != split_context(\"\", \',\')",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x236);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"a",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"b",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"c d e f",(allocator<char> *)&formatted_input);
  __l_06._M_len = 3;
  __l_06._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_06,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"a b c d e f",(allocator<char> *)&expected_offsets);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,' ',2);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"a\", \"b\", \"c d e f\"}) != split_context(\"a b c d e f\", \' \', 2)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x237);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"3(4,56)7",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"ab[c,]d",(allocator<char> *)&formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"e{fg(h,),}",(allocator<char> *)&local_50);
  __l_07._M_len = 4;
  __l_07._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_07,(allocator_type *)&expected_offsets);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12,3(4,56)7,ab[c,]d,e{fg(h,),}",&local_1b9);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"3(4,56)7\", \"ab[c,]d\", \"e{fg(h,),}\"}) != split_context(\"12,3(4,56)7,ab[c,]d,e{fg(h,),}\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x239);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x60;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"(34,567)",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  __l_08._M_len = 3;
  __l_08._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_08,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12,(34,567),abc",(allocator<char> *)&expected_offsets);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"(34,567)\", \"abc\"}) != split_context(\"12,(34,567),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,"12(,(34),567)",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"abc",(allocator<char> *)&expected_formatted_input);
  __l_09._M_len = 2;
  __l_09._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_09,(allocator_type *)&formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12(,(34),567),abc",(allocator<char> *)&local_50);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12(,(34),567)\", \"abc\"}) != split_context(\"12(,(34),567),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x20;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"(,567)",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  __l_10._M_len = 3;
  __l_10._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_10,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12,(,567),abc",(allocator<char> *)&expected_offsets);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"(,567)\", \"abc\"}) != split_context(\"12,(,567),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"(34,)",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  __l_11._M_len = 3;
  __l_11._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_11,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12,(34,),abc",(allocator<char> *)&expected_offsets);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"(34,)\", \"abc\"}) != split_context(\"12,(34,),abc\", \',\')"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"(,)",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  __l_12._M_len = 3;
  __l_12._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_12,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12,(,),abc",(allocator<char> *)&expected_offsets);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',0);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"(,)\", \"abc\"}) != split_context(\"12,(,),abc\", \',\')",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"(34,567),abc",(allocator<char> *)&expected_formatted_input);
  __l_13._M_len = 2;
  __l_13._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_13,(allocator_type *)&formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12,(34,567),abc",(allocator<char> *)&local_50);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',1);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"(34,567),abc\"}) != split_context(\"12,(34,567),abc\", \',\', 1)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x23f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x20;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"(12,34)",(allocator<char> *)&s5)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"567,abc",(allocator<char> *)&expected_formatted_input);
  __l_14._M_len = 2;
  __l_14._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_14,(allocator_type *)&formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"(12,34),567,abc",(allocator<char> *)&local_50);
  phosg::split_context
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s4,&s2,',',1);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"(12,34)\", \"567,abc\"}) != split_context(\"(12,34),567,abc\", \',\', 1)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x20;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  fwrite("-- split_args\n",0xe,1,_stderr);
  s2._M_dataplus._M_p = (pointer)0x0;
  s2._M_string_length = 0;
  s2.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"",(allocator<char> *)&s4);
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s3,&s1);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s3);
  phosg::expect_generic
            (bVar1,"vector<string>() != split_args(\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x245);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  s2._M_dataplus._M_p = (pointer)0x0;
  s2._M_string_length = 0;
  s2.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"      ",(allocator<char> *)&s4);
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s3,&s1);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s3);
  phosg::expect_generic
            (bVar1,"vector<string>() != split_args(\"      \")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x246);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"567",(allocator<char> *)&formatted_input);
  std::__cxx11::string::string<std::allocator<char>>(local_118,"abc",(allocator<char> *)&local_50);
  __l_15._M_len = 4;
  __l_15._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_15,(allocator_type *)&expected_offsets);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"12 34 567 abc",&local_1b9);
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s4,&s2);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34\", \"567\", \"abc\"}) != split_args(\"12 34 567 abc\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x247);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x60;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34 567",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  __l_16._M_len = 3;
  __l_16._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_16,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12 \'34 567\' abc",(allocator<char> *)&expected_offsets);
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s4,&s2);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"12 \\\'34 567\\\' abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34 567",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  __l_17._M_len = 3;
  __l_17._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_17,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12 \"34 567\" abc",(allocator<char> *)&expected_offsets);
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s4,&s2);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"12 \\\"34 567\\\" abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x249);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34 \'567",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  __l_18._M_len = 3;
  __l_18._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_18,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12 \'34 \\\'567\' abc",(allocator<char> *)&expected_offsets);
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s4,&s2);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34 \\\'567\", \"abc\"}) != split_args(\"12 \\\'34 \\\\\\\'567\\\' abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34 \"567",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  __l_19._M_len = 3;
  __l_19._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_19,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12 \"34 \\\"567\" abc",(allocator<char> *)&expected_offsets);
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s4,&s2);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34 \\\"567\", \"abc\"}) != split_args(\"12 \\\"34 \\\\\\\"567\\\" abc\")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34 567",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  __l_20._M_len = 3;
  __l_20._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_20,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"12 34\\ 567 abc",(allocator<char> *)&expected_offsets);
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s4,&s2);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"12 34\\\\ 567 abc\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34 567",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  __l_21._M_len = 3;
  __l_21._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_21,(allocator_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"   12 34\\ 567 abc   ",(allocator<char> *)&expected_offsets);
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s4,&s2);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34 567\", \"abc\"}) != split_args(\"   12 34\\\\ 567 abc   \")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"12",(allocator<char> *)&s5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"34 567",(allocator<char> *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"abc",(allocator<char> *)&formatted_input);
  std::__cxx11::string::string<std::allocator<char>>(local_118," ",(allocator<char> *)&local_50);
  __l_22._M_len = 4;
  __l_22._M_array = &s1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s3,__l_22,(allocator_type *)&expected_offsets);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"   12 34\\ 567 abc  \\   ",&local_1b9);
  phosg::split_args((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s4,&s2);
  bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&s4);
  phosg::expect_generic
            (bVar1,
             "vector<string>({\"12\", \"34 567\", \"abc\", \" \"}) != split_args(\"   12 34\\\\ 567 abc  \\\\   \")"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x24e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s4);
  std::__cxx11::string::~string((string *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  lVar6 = 0x60;
  do {
    std::__cxx11::string::~string(local_158 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  fwrite("-- skip_whitespace/skip_non_whitespace\n",0x27,1,_stderr);
  sVar3 = phosg::skip_whitespace("1234",0);
  phosg::expect_generic
            (sVar3 == 0,"0 != skip_whitespace(\"1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x252);
  sVar3 = phosg::skip_whitespace("  1234",0);
  phosg::expect_generic
            (sVar3 == 2,"2 != skip_whitespace(\"  1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x253);
  sVar3 = phosg::skip_whitespace("  \t\r\n  1234",0);
  phosg::expect_generic
            (sVar3 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x254);
  sVar3 = phosg::skip_whitespace("  \t\r\n  1234",3);
  phosg::expect_generic
            (sVar3 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  1234\", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x255);
  sVar3 = phosg::skip_whitespace("  \t\r\n  ",0);
  phosg::expect_generic
            (sVar3 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  \", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x256);
  sVar3 = phosg::skip_whitespace("  \t\r\n  ",3);
  phosg::expect_generic
            (sVar3 == 7,"7 != skip_whitespace(\"  \\t\\r\\n  \", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,599);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234",(allocator<char> *)&s2);
  sVar3 = phosg::skip_whitespace(&s1,0);
  phosg::expect_generic
            (sVar3 == 0,"0 != skip_whitespace(string(\"1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,600);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"  1234",(allocator<char> *)&s2);
  sVar3 = phosg::skip_whitespace(&s1,0);
  phosg::expect_generic
            (sVar3 == 2,"2 != skip_whitespace(string(\"  1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x259);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,"  \t\r\n  1234",(allocator<char> *)&s2);
  sVar3 = phosg::skip_whitespace(&s1,0);
  phosg::expect_generic
            (sVar3 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25a);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,"  \t\r\n  1234",(allocator<char> *)&s2);
  sVar3 = phosg::skip_whitespace(&s1,3);
  phosg::expect_generic
            (sVar3 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  1234\"), 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25b);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,"  \t\r\n  ",(allocator<char> *)&s2);
  sVar3 = phosg::skip_whitespace(&s1,0);
  phosg::expect_generic
            (sVar3 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  \"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25c);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,"  \t\r\n  ",(allocator<char> *)&s2);
  sVar3 = phosg::skip_whitespace(&s1,3);
  phosg::expect_generic
            (sVar3 == 7,"7 != skip_whitespace(string(\"  \\t\\r\\n  \"), 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25d);
  std::__cxx11::string::~string((string *)&s1);
  sVar3 = phosg::skip_non_whitespace("1234 ",0);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(\"1234 \", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25e);
  sVar3 = phosg::skip_non_whitespace("1234 ",2);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(\"1234 \", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x25f);
  sVar3 = phosg::skip_non_whitespace("1234\t",0);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(\"1234\\t\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x260);
  sVar3 = phosg::skip_non_whitespace("1234\t",2);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(\"1234\\t\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x261);
  sVar3 = phosg::skip_non_whitespace("1234\r",0);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(\"1234\\r\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x262);
  sVar3 = phosg::skip_non_whitespace("1234\r",2);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(\"1234\\r\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x263);
  sVar3 = phosg::skip_non_whitespace("1234\n",0);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(\"1234\\n\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x264);
  sVar3 = phosg::skip_non_whitespace("1234\n",2);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(\"1234\\n\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x265);
  sVar3 = phosg::skip_non_whitespace("1234",0);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(\"1234\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x266);
  sVar3 = phosg::skip_non_whitespace("1234",2);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(\"1234\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x267);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234 ",(allocator<char> *)&s2);
  sVar3 = phosg::skip_non_whitespace(&s1,0);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(string(\"1234 \"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x268);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234 ",(allocator<char> *)&s2);
  sVar3 = phosg::skip_non_whitespace(&s1,2);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(string(\"1234 \"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x269);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234\t",(allocator<char> *)&s2);
  sVar3 = phosg::skip_non_whitespace(&s1,0);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(string(\"1234\\t\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26a);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234\t",(allocator<char> *)&s2);
  sVar3 = phosg::skip_non_whitespace(&s1,2);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(string(\"1234\\t\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26b);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234\r",(allocator<char> *)&s2);
  sVar3 = phosg::skip_non_whitespace(&s1,0);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(string(\"1234\\r\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26c);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234\r",(allocator<char> *)&s2);
  sVar3 = phosg::skip_non_whitespace(&s1,2);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(string(\"1234\\r\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26d);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234\n",(allocator<char> *)&s2);
  sVar3 = phosg::skip_non_whitespace(&s1,0);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(string(\"1234\\n\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26e);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234\n",(allocator<char> *)&s2);
  sVar3 = phosg::skip_non_whitespace(&s1,2);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(string(\"1234\\n\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x26f);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234",(allocator<char> *)&s2);
  sVar3 = phosg::skip_non_whitespace(&s1,0);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(string(\"1234\"), 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x270);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"1234",(allocator<char> *)&s2);
  sVar3 = phosg::skip_non_whitespace(&s1,2);
  phosg::expect_generic
            (sVar3 == 4,"4 != skip_non_whitespace(string(\"1234\"), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x271);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- skip_word\n",0xd,1,_stderr);
  puVar7 = &DAT_00121100;
  psVar8 = &s1;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (psVar8->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    psVar8 = (string *)((long)psVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  __l_23._M_len = 9;
  __l_23._M_array = (iterator)&s1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&expected_offsets,__l_23,(allocator_type *)&s2);
  s1._M_dataplus._M_p = (pointer)0x0;
  s1._M_string_length = 0;
  s1.field_2._M_allocated_capacity = 0;
  s2._M_dataplus._M_p = (pointer)0x0;
  while (s2._M_dataplus._M_p[0x1243da] != '\0') {
    s2._M_dataplus._M_p =
         (pointer)phosg::skip_word("The quick brown fox jumped over the lazy dog.",
                                   s2._M_dataplus._M_p);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&s1,(unsigned_long *)&s2);
  }
  bVar1 = std::operator==(&expected_offsets,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&s1);
  phosg::expect_generic
            (bVar1,"expected_offsets != offsets",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x27d);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&s1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,"The quick brown fox jumped over the lazy dog.",(allocator<char> *)&s2);
  s2._M_dataplus._M_p = (pointer)0x0;
  s2._M_string_length = 0;
  s2.field_2._M_allocated_capacity = 0;
  s3._M_dataplus._M_p = (pointer)0x0;
  while (s1._M_dataplus._M_p[(long)s3._M_dataplus._M_p] != '\0') {
    s3._M_dataplus._M_p = (pointer)phosg::skip_word(&s1,s3._M_dataplus._M_p);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&s2,(unsigned_long *)&s3);
  }
  bVar1 = std::operator==(&expected_offsets,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&s2);
  phosg::expect_generic
            (bVar1,"expected_offsets != offsets",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x287);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- parse_data_string/format_data_string with arbitrary data\n",0x3c,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,
             "/* omit 01 02 */ 03 ?04? $ ##30 $ ##127 ?\"dark\"? ###-1 \'cold\' %-1.667 %%-2.667",
             (allocator<char> *)&s2);
  s2._M_dataplus._M_p = (pointer)&s2.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s2,"\x03\x04","");
  s3._M_dataplus._M_p = (pointer)&s3.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&s3,anon_var_dwarf_13c9,anon_var_dwarf_13c9 + 0x22);
  s4._M_dataplus._M_p = (pointer)&s4.field_2;
  s4._M_string_length = 0;
  s4.field_2._M_local_buf[0] = '\0';
  phosg::parse_data_string(&s5,&s1,&s4,0);
  _Var2 = std::operator==(&s2,&s5);
  phosg::expect_generic
            (_Var2,"expected_data != output_data",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x29a);
  _Var2 = std::operator==(&s3,&s4);
  phosg::expect_generic
            (_Var2,"expected_mask != output_mask",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x29b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected_formatted_input,
             "03?04?001E7F00?6461726B?FFFFFFFF63006F006C0064004260D5BFBC749318045605C0",
             (allocator<char> *)&formatted_input);
  phosg::format_data_string(&formatted_input,&s5,&s4,0);
  _Var2 = std::operator==(&expected_formatted_input,&formatted_input);
  phosg::expect_generic
            (_Var2,"expected_formatted_input != formatted_input",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2a0);
  phosg::parse_data_string(&local_50,&s1,&s4,0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&s5,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  _Var2 = std::operator==(&s2,&s5);
  phosg::expect_generic
            (_Var2,"expected_data != output_data",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2a3);
  _Var2 = std::operator==(&s3,&s4);
  phosg::expect_generic
            (_Var2,"expected_mask != output_mask",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2a4);
  std::__cxx11::string::~string((string *)&formatted_input);
  std::__cxx11::string::~string((string *)&expected_formatted_input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected_formatted_input,
             "0304001E7F006461726BFFFFFFFF63006F006C0064004260D5BFBC749318045605C0",
             (allocator<char> *)&formatted_input);
  phosg::format_data_string(&formatted_input,&s5,(string *)0x0,0);
  _Var2 = std::operator==(&expected_formatted_input,&formatted_input);
  phosg::expect_generic
            (_Var2,"expected_formatted_input != formatted_input",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2aa);
  phosg::parse_data_string(&local_50,&s1,&s4,0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&s5,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  _Var2 = std::operator==(&s2,&s5);
  phosg::expect_generic
            (_Var2,"expected_data != output_data",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ad);
  _Var2 = std::operator==(&s3,&s4);
  phosg::expect_generic
            (_Var2,"expected_mask != output_mask",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ae);
  std::__cxx11::string::~string((string *)&formatted_input);
  std::__cxx11::string::~string((string *)&expected_formatted_input);
  std::__cxx11::string::~string((string *)&s5);
  std::__cxx11::string::~string((string *)&s4);
  std::__cxx11::string::~string((string *)&s3);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- parse_data_string/format_data_string with printable data\n",0x3c,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,
             "this is printable\nand it is sort of a haiku\nwith some control bytes\t\r\n",
             (allocator<char> *)&s2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,
             "\"this is printable\\nand it is sort of a haiku\\nwith some control bytes\\t\\r\\n\"",
             (allocator<char> *)&s3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s3,
             "74686973206973207072696E7461626C650A616E6420697420697320736F7274206F662061206861696B750A7769746820736F6D6520636F6E74726F6C206279746573090D0A"
             ,(allocator<char> *)&s4);
  phosg::format_data_string(&s4,&s1,(string *)0x0,0);
  _Var2 = std::operator==(&s2,&s4);
  phosg::expect_generic
            (_Var2,"expected_formatted != formatted",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2b8);
  phosg::parse_data_string(&s5,&s4,(string *)0x0,0);
  _Var2 = std::operator==(&s1,&s5);
  phosg::expect_generic
            (_Var2,"input != parse_data_string(formatted)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2b9);
  std::__cxx11::string::~string((string *)&s5);
  phosg::format_data_string(&s5,&s1,(string *)0x0,1);
  _Var2 = std::operator==(&s3,&s5);
  phosg::expect_generic
            (_Var2,"expected_formatted_hex != formatted_hex",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,699);
  phosg::parse_data_string(&expected_formatted_input,&s5,(string *)0x0,0);
  _Var2 = std::operator==(&s1,&expected_formatted_input);
  phosg::expect_generic
            (_Var2,"input != parse_data_string(formatted_hex)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,700);
  std::__cxx11::string::~string((string *)&expected_formatted_input);
  std::__cxx11::string::~string((string *)&s5);
  std::__cxx11::string::~string((string *)&s4);
  std::__cxx11::string::~string((string *)&s3);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- parse_data_string/format_data_string with quotes in printable data\n",0x46,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,"this string has \"some\" \'quotes\'.",(allocator<char> *)&s2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"\"this string has \\\"some\\\" \\\'quotes\\\'.\"",(allocator<char> *)&s3
            );
  phosg::format_data_string(&s3,&s1,(string *)0x0,0);
  _Var2 = std::operator==(&s2,&s3);
  phosg::expect_generic
            (_Var2,"expected_formatted != formatted",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2c4);
  phosg::parse_data_string(&s4,&s3,(string *)0x0,0);
  _Var2 = std::operator==(&s1,&s4);
  phosg::expect_generic
            (_Var2,"input != parse_data_string(formatted)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2c5);
  std::__cxx11::string::~string((string *)&s4);
  std::__cxx11::string::~string((string *)&s3);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  pFVar5 = _stderr;
  fwrite("-- format_size\n",0xf,1,_stderr);
  phosg::format_size_abi_cxx11_(&s1,(phosg *)0x0,0,SUB81(pFVar5,0));
  bVar1 = std::operator==(&s1,"0 bytes");
  uVar4 = 0xca;
  phosg::expect_generic
            (bVar1,"\"0 bytes\" != format_size(0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ca);
  std::__cxx11::string::~string((string *)&s1);
  phosg::format_size_abi_cxx11_(&s1,(phosg *)0x3e8,0,(bool)uVar4);
  bVar1 = std::operator==(&s1,"1000 bytes");
  uVar4 = 0xcb;
  phosg::expect_generic
            (bVar1,"\"1000 bytes\" != format_size(1000)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cb);
  std::__cxx11::string::~string((string *)&s1);
  phosg::format_size_abi_cxx11_(&s1,(phosg *)0x600,0,(bool)uVar4);
  bVar1 = std::operator==(&s1,"1.50 KB");
  uVar4 = 0xcc;
  phosg::expect_generic
            (bVar1,"\"1.50 KB\" != format_size(1536)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cc);
  std::__cxx11::string::~string((string *)&s1);
  phosg::format_size_abi_cxx11_(&s1,(phosg *)0x600,1,(bool)uVar4);
  bVar1 = std::operator==(&s1,"1536 bytes (1.50 KB)");
  uVar4 = 0xcd;
  phosg::expect_generic
            (bVar1,"\"1536 bytes (1.50 KB)\" != format_size(1536, true)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cd);
  std::__cxx11::string::~string((string *)&s1);
  phosg::format_size_abi_cxx11_(&s1,(phosg *)0x40000000,0,(bool)uVar4);
  bVar1 = std::operator==(&s1,"1.00 GB");
  uVar4 = 0xce;
  phosg::expect_generic
            (bVar1,"\"1.00 GB\" != format_size(1073741824)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2ce);
  std::__cxx11::string::~string((string *)&s1);
  phosg::format_size_abi_cxx11_(&s1,(phosg *)0x40000000,1,(bool)uVar4);
  bVar1 = std::operator==(&s1,"1073741824 bytes (1.00 GB)");
  phosg::expect_generic
            (bVar1,"\"1073741824 bytes (1.00 GB)\" != format_size(1073741824, true)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2cf);
  std::__cxx11::string::~string((string *)&s1);
  fwrite("-- parse_size\n",0xe,1,_stderr);
  sVar3 = phosg::parse_size("0");
  phosg::expect_generic
            (sVar3 == 0,"0 != parse_size(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d4);
  sVar3 = phosg::parse_size("0B");
  phosg::expect_generic
            (sVar3 == 0,"0 != parse_size(\"0B\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d5);
  sVar3 = phosg::parse_size("0 B");
  phosg::expect_generic
            (sVar3 == 0,"0 != parse_size(\"0 B\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d6);
  sVar3 = phosg::parse_size("0 bytes");
  phosg::expect_generic
            (sVar3 == 0,"0 != parse_size(\"0 bytes\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d7);
  sVar3 = phosg::parse_size("1000 bytes");
  phosg::expect_generic
            (sVar3 == 1000,"1000 != parse_size(\"1000 bytes\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d8);
  sVar3 = phosg::parse_size("1.5 KB");
  phosg::expect_generic
            (sVar3 == 0x600,"1536 != parse_size(\"1.5 KB\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2d9);
  sVar3 = phosg::parse_size("3 MB");
  phosg::expect_generic
            (sVar3 == 0x300000,"3 * 1024 * 1024 != parse_size(\"3 MB\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2da);
  fwrite("-- escape_quotes\n",0x11,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"",(allocator<char> *)&s3);
  phosg::escape_quotes(&s1,&s2);
  bVar1 = std::operator==(&s1,"");
  phosg::expect_generic
            (bVar1,"\"\" != escape_quotes(\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2df);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"omg hax",(allocator<char> *)&s3)
  ;
  phosg::escape_quotes(&s1,&s2);
  bVar1 = std::operator==(&s1,"omg hax");
  phosg::expect_generic
            (bVar1,"\"omg hax\" != escape_quotes(\"omg hax\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e0);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"\'omg\' \"hax\"",(allocator<char> *)&s3);
  phosg::escape_quotes(&s1,&s2);
  bVar1 = std::operator==(&s1,"\'omg\' \\\"hax\\\"");
  phosg::expect_generic
            (bVar1,
             "\"\\\'omg\\\' \\\\\\\"hax\\\\\\\"\" != escape_quotes(\"\\\'omg\\\' \\\"hax\\\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e1);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  fwrite("-- escape_url\n",0xe,1,_stderr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"",(allocator<char> *)&s3);
  phosg::escape_url(&s1,&s2,false);
  bVar1 = std::operator==(&s1,"");
  phosg::expect_generic
            (bVar1,"\"\" != escape_url(\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e6);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s2,"omg hax",(allocator<char> *)&s3)
  ;
  phosg::escape_url(&s1,&s2,false);
  bVar1 = std::operator==(&s1,"omg%20hax");
  phosg::expect_generic
            (bVar1,"\"omg%20hax\" != escape_url(\"omg hax\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e7);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"slash/es",(allocator<char> *)&s3);
  phosg::escape_url(&s1,&s2,false);
  bVar1 = std::operator==(&s1,"slash/es");
  phosg::expect_generic
            (bVar1,"\"slash/es\" != escape_url(\"slash/es\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e8);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"slash/es",(allocator<char> *)&s3);
  phosg::escape_url(&s1,&s2,true);
  bVar1 = std::operator==(&s1,"slash%2Fes");
  phosg::expect_generic
            (bVar1,"\"slash%2Fes\" != escape_url(\"slash/es\", true)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x2e9);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&s2);
  print_data_test();
  test_bit_reader();
  test_string_reader();
  unlink("StringsTest-data");
  puts("StringsTest: all tests passed");
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&expected_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return 0;
}

Assistant:

int main(int, char**) {

  fprintf(stderr, "-- starts_with\n");
  expect(starts_with("abcdef", "abc"));
  expect(starts_with("abcdef", "abcdef"));
  expect(!starts_with("abcdef", "abcdefg"));
  expect(!starts_with("abcdef", "abd"));
  expect(!starts_with("abcdef", "dbc"));

  fprintf(stderr, "-- ends_with\n");
  expect(ends_with("abcdef", "def"));
  expect(ends_with("abcdef", "abcdef"));
  expect(!ends_with("abcdef", "gabcdef"));
  expect(!ends_with("abcdef", "ded"));
  expect(!ends_with("abcdef", "fef"));

  {
    fprintf(stderr, "-- str_replace_all\n");
    expect_eq("", str_replace_all(string(""), "def", "xyz"));
    expect_eq("abcdef", str_replace_all(string("abcdef"), "efg", "xyz"));
    expect_eq("abcxyz", str_replace_all(string("abcdef"), "def", "xyz"));
    expect_eq("abcxyzabc", str_replace_all(string("abcdefabc"), "def", "xyz"));
    expect_eq("abcxyzabcxyz", str_replace_all(string("abcdefabcdef"), "def", "xyz"));
    expect_eq("abcxyzabcxyzabc", str_replace_all(string("abcdefabcdefabc"), "def", "xyz"));
    expect_eq("xyzabcxyzabcxyzabc", str_replace_all(string("defabcdefabcdefabc"), "def", "xyz"));
  }

  {
    fprintf(stderr, "-- strip_trailing_zeroes\n");
    string s1("abcdef", 6);
    strip_trailing_zeroes(s1);
    expect_eq(s1, "abcdef");
    string s2("abcdef\0", 7);
    strip_trailing_zeroes(s2);
    expect_eq(s2, "abcdef");
    string s3("abcdef\0\0\0\0\0", 11);
    strip_trailing_zeroes(s3);
    expect_eq(s3, "abcdef");
    string s4("", 0);
    strip_trailing_zeroes(s4);
    expect_eq(s4, "");
    string s5("\0\0\0\0\0", 5);
    strip_trailing_zeroes(s5);
    expect_eq(s5, "");
  }

  {
    fprintf(stderr, "-- strip_trailing_whitespace\n");
    string s1 = "abcdef";
    strip_trailing_whitespace(s1);
    expect_eq(s1, "abcdef");
    string s2 = "abcdef\r\n";
    strip_trailing_whitespace(s2);
    expect_eq(s2, "abcdef");
    string s3 = "abc\tdef  \r\n";
    strip_trailing_whitespace(s3);
    expect_eq(s3, "abc\tdef");
    string s4 = "";
    strip_trailing_whitespace(s4);
    expect_eq(s4, "");
    string s5 = "   \t\r\n  ";
    strip_trailing_whitespace(s5);
    expect_eq(s5, "");
  }

  {
    fprintf(stderr, "-- strip_whitespace\n");

    string s = "abcdef";
    strip_whitespace(s);
    expect_eq(s, "abcdef");

    s = "abcdef\r\n";
    strip_whitespace(s);
    expect_eq(s, "abcdef");

    s = "  \nabc\tdef";
    strip_whitespace(s);
    expect_eq(s, "abc\tdef");

    s = "  \nabc\tdef  \r\n";
    strip_whitespace(s);
    expect_eq(s, "abc\tdef");

    s = "";
    strip_whitespace(s);
    expect_eq(s, "");

    s = "   \t\r\n  ";
    strip_whitespace(s);
    expect_eq(s, "");
  }

  {
    fprintf(stderr, "-- strip_multiline_comments\n");

    string s = "abc/*def*/ghi";
    strip_multiline_comments(s);
    expect_eq(s, "abcghi");

    s = "/*abc*/def\r\n";
    strip_multiline_comments(s);
    expect_eq(s, "def\r\n");

    s = "abc\n/*def\nghi*/\njkl";
    strip_multiline_comments(s);
    expect_eq(s, "abc\n\n\njkl");
  }

  {
    fprintf(stderr, "-- string_printf\n");
    string result = string_printf("%s %" PRIu64 " 0x%04hX", "lolz",
        static_cast<uint64_t>(1000), static_cast<uint16_t>(0x4F));
    fprintf(stderr, "%s\n", result.c_str());
    expect_eq("lolz 1000 0x004F", result);
  }

  {
    fprintf(stderr, "-- split\n");
    expect_eq(vector<string>({"12", "34", "567", "abc"}), split("12,34,567,abc", ','));
    expect_eq(vector<string>({"12", "34", "567", "", ""}), split("12,34,567,,", ','));
    expect_eq(vector<string>({""}), split("", ','));
    expect_eq(vector<string>({"a", "b", "c d e f"}), split("a b c d e f", ' ', 2));
  }

  {
    fprintf(stderr, "-- split_context\n");
    expect_eq(vector<string>({"12", "34", "567", "abc"}), split_context("12,34,567,abc", ','));
    expect_eq(vector<string>({"12", "34", "567", "", ""}), split_context("12,34,567,,", ','));
    expect_eq(vector<string>({""}), split_context("", ','));
    expect_eq(vector<string>({"a", "b", "c d e f"}), split_context("a b c d e f", ' ', 2));
    expect_eq(vector<string>({"12", "3(4,56)7", "ab[c,]d", "e{fg(h,),}"}),
        split_context("12,3(4,56)7,ab[c,]d,e{fg(h,),}", ','));
    expect_eq(vector<string>({"12", "(34,567)", "abc"}), split_context("12,(34,567),abc", ','));
    expect_eq(vector<string>({"12(,(34),567)", "abc"}), split_context("12(,(34),567),abc", ','));
    expect_eq(vector<string>({"12", "(,567)", "abc"}), split_context("12,(,567),abc", ','));
    expect_eq(vector<string>({"12", "(34,)", "abc"}), split_context("12,(34,),abc", ','));
    expect_eq(vector<string>({"12", "(,)", "abc"}), split_context("12,(,),abc", ','));
    expect_eq(vector<string>({"12", "(34,567),abc"}), split_context("12,(34,567),abc", ',', 1));
    expect_eq(vector<string>({"(12,34)", "567,abc"}), split_context("(12,34),567,abc", ',', 1));
  }

  {
    fprintf(stderr, "-- split_args\n");
    expect_eq(vector<string>(), split_args(""));
    expect_eq(vector<string>(), split_args("      "));
    expect_eq(vector<string>({"12", "34", "567", "abc"}), split_args("12 34 567 abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("12 \'34 567\' abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("12 \"34 567\" abc"));
    expect_eq(vector<string>({"12", "34 \'567", "abc"}), split_args("12 \'34 \\\'567\' abc"));
    expect_eq(vector<string>({"12", "34 \"567", "abc"}), split_args("12 \"34 \\\"567\" abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("12 34\\ 567 abc"));
    expect_eq(vector<string>({"12", "34 567", "abc"}), split_args("   12 34\\ 567 abc   "));
    expect_eq(vector<string>({"12", "34 567", "abc", " "}), split_args("   12 34\\ 567 abc  \\   "));
  }

  fprintf(stderr, "-- skip_whitespace/skip_non_whitespace\n");
  expect_eq(0, skip_whitespace("1234", 0));
  expect_eq(2, skip_whitespace("  1234", 0));
  expect_eq(7, skip_whitespace("  \t\r\n  1234", 0));
  expect_eq(7, skip_whitespace("  \t\r\n  1234", 3));
  expect_eq(7, skip_whitespace("  \t\r\n  ", 0));
  expect_eq(7, skip_whitespace("  \t\r\n  ", 3));
  expect_eq(0, skip_whitespace(string("1234"), 0));
  expect_eq(2, skip_whitespace(string("  1234"), 0));
  expect_eq(7, skip_whitespace(string("  \t\r\n  1234"), 0));
  expect_eq(7, skip_whitespace(string("  \t\r\n  1234"), 3));
  expect_eq(7, skip_whitespace(string("  \t\r\n  "), 0));
  expect_eq(7, skip_whitespace(string("  \t\r\n  "), 3));
  expect_eq(4, skip_non_whitespace("1234 ", 0));
  expect_eq(4, skip_non_whitespace("1234 ", 2));
  expect_eq(4, skip_non_whitespace("1234\t", 0));
  expect_eq(4, skip_non_whitespace("1234\t", 2));
  expect_eq(4, skip_non_whitespace("1234\r", 0));
  expect_eq(4, skip_non_whitespace("1234\r", 2));
  expect_eq(4, skip_non_whitespace("1234\n", 0));
  expect_eq(4, skip_non_whitespace("1234\n", 2));
  expect_eq(4, skip_non_whitespace("1234", 0));
  expect_eq(4, skip_non_whitespace("1234", 2));
  expect_eq(4, skip_non_whitespace(string("1234 "), 0));
  expect_eq(4, skip_non_whitespace(string("1234 "), 2));
  expect_eq(4, skip_non_whitespace(string("1234\t"), 0));
  expect_eq(4, skip_non_whitespace(string("1234\t"), 2));
  expect_eq(4, skip_non_whitespace(string("1234\r"), 0));
  expect_eq(4, skip_non_whitespace(string("1234\r"), 2));
  expect_eq(4, skip_non_whitespace(string("1234\n"), 0));
  expect_eq(4, skip_non_whitespace(string("1234\n"), 2));
  expect_eq(4, skip_non_whitespace(string("1234"), 0));
  expect_eq(4, skip_non_whitespace(string("1234"), 2));

  fprintf(stderr, "-- skip_word\n");
  const char* sentence = "The quick brown fox jumped over the lazy dog.";
  vector<size_t> expected_offsets = {4, 10, 16, 20, 27, 32, 36, 41, 45};
  {
    vector<size_t> offsets;
    size_t offset = 0;
    while (sentence[offset]) {
      offset = skip_word(sentence, offset);
      offsets.emplace_back(offset);
    }
    expect_eq(expected_offsets, offsets);
  }
  {
    string sentence_str(sentence);
    vector<size_t> offsets;
    size_t offset = 0;
    while (sentence_str[offset]) {
      offset = skip_word(sentence_str, offset);
      offsets.emplace_back(offset);
    }
    expect_eq(expected_offsets, offsets);
  }

  fprintf(stderr, "-- parse_data_string/format_data_string with arbitrary data\n");
  {
    string input("/* omit 01 02 */ 03 ?04? $ ##30 $ ##127 ?\"dark\"? ###-1 \'cold\' %-1.667 %%-2.667");
    string expected_data(
        "\x03\x04" // 03 ?04?
        "\x00\x1E" // $ ##30 $
        "\x7F\x00" // ##127
        "\x64\x61\x72\x6B" // ?"dark"?
        "\xFF\xFF\xFF\xFF" // ###-1
        "\x63\x00\x6F\x00\x6C\x00\x64\x00" // 'cold'
        "\x42\x60\xD5\xBF" // %-1.667
        "\xBC\x74\x93\x18\x04\x56\x05\xC0", // %%-2.667
        34);
    string expected_mask("\xFF\x00\xFF\xFF\xFF\xFF\x00\x00\x00\x00\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF\xFF", 34);
    string output_mask;
    string output_data = parse_data_string(input, &output_mask);
    expect_eq(expected_data, output_data);
    expect_eq(expected_mask, output_mask);

    {
      string expected_formatted_input("03?04?001E7F00?6461726B?FFFFFFFF63006F006C0064004260D5BFBC749318045605C0");
      string formatted_input = format_data_string(output_data, &output_mask);
      expect_eq(expected_formatted_input, formatted_input);

      output_data = parse_data_string(input, &output_mask);
      expect_eq(expected_data, output_data);
      expect_eq(expected_mask, output_mask);
    }

    {
      string expected_formatted_input("0304001E7F006461726BFFFFFFFF63006F006C0064004260D5BFBC749318045605C0");
      string formatted_input = format_data_string(output_data, nullptr);
      expect_eq(expected_formatted_input, formatted_input);

      output_data = parse_data_string(input, &output_mask);
      expect_eq(expected_data, output_data);
      expect_eq(expected_mask, output_mask);
    }
  }

  fprintf(stderr, "-- parse_data_string/format_data_string with printable data\n");
  {
    string input("this is printable\nand it is sort of a haiku\nwith some control bytes\t\r\n");
    string expected_formatted("\"this is printable\\nand it is sort of a haiku\\nwith some control bytes\\t\\r\\n\"");
    string expected_formatted_hex("74686973206973207072696E7461626C650A616E6420697420697320736F7274206F662061206861696B750A7769746820736F6D6520636F6E74726F6C206279746573090D0A");
    string formatted = format_data_string(input);
    expect_eq(expected_formatted, formatted);
    expect_eq(input, parse_data_string(formatted));
    string formatted_hex = format_data_string(input, nullptr, FormatDataFlags::HEX_ONLY);
    expect_eq(expected_formatted_hex, formatted_hex);
    expect_eq(input, parse_data_string(formatted_hex));
  }

  fprintf(stderr, "-- parse_data_string/format_data_string with quotes in printable data\n");
  {
    string input("this string has \"some\" \'quotes\'.");
    string expected_formatted("\"this string has \\\"some\\\" \\\'quotes\\\'.\"");
    string formatted = format_data_string(input);
    expect_eq(expected_formatted, formatted);
    expect_eq(input, parse_data_string(formatted));
  }

  fprintf(stderr, "-- format_size\n");
  {
    expect_eq("0 bytes", format_size(0));
    expect_eq("1000 bytes", format_size(1000));
    expect_eq("1.50 KB", format_size(1536));
    expect_eq("1536 bytes (1.50 KB)", format_size(1536, true));
    expect_eq("1.00 GB", format_size(1073741824));
    expect_eq("1073741824 bytes (1.00 GB)", format_size(1073741824, true));
  }

  fprintf(stderr, "-- parse_size\n");
  {
    expect_eq(0, parse_size("0"));
    expect_eq(0, parse_size("0B"));
    expect_eq(0, parse_size("0 B"));
    expect_eq(0, parse_size("0 bytes"));
    expect_eq(1000, parse_size("1000 bytes"));
    expect_eq(1536, parse_size("1.5 KB"));
    expect_eq(3 * 1024 * 1024, parse_size("3 MB"));
  }

  fprintf(stderr, "-- escape_quotes\n");
  {
    expect_eq("", escape_quotes(""));
    expect_eq("omg hax", escape_quotes("omg hax"));
    expect_eq("\'omg\' \\\"hax\\\"", escape_quotes("\'omg\' \"hax\""));
  }

  fprintf(stderr, "-- escape_url\n");
  {
    expect_eq("", escape_url(""));
    expect_eq("omg%20hax", escape_url("omg hax"));
    expect_eq("slash/es", escape_url("slash/es"));
    expect_eq("slash%2Fes", escape_url("slash/es", true));
  }

  print_data_test();

  test_bit_reader();

  test_string_reader();

  // TODO: test string_vprintf
  // TODO: test log_level, set_log_level, log
  // TODO: test get_time_string
  // TODO: test string_for_error

  unlink("StringsTest-data");

  printf("StringsTest: all tests passed\n");
  return 0;
}